

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# interp-inl.h
# Opt level: O2

void __thiscall
wabt::interp::FreeList<wabt::interp::Object_*>::~FreeList(FreeList<wabt::interp::Object_*> *this)

{
  pointer ppOVar1;
  Object *pOVar2;
  vector<wabt::interp::Object_*,_std::allocator<wabt::interp::Object_*>_> *__range2;
  pointer ppOVar3;
  
  ppOVar1 = (this->list_).
            super__Vector_base<wabt::interp::Object_*,_std::allocator<wabt::interp::Object_*>_>.
            _M_impl.super__Vector_impl_data._M_finish;
  for (ppOVar3 = (this->list_).
                 super__Vector_base<wabt::interp::Object_*,_std::allocator<wabt::interp::Object_*>_>
                 ._M_impl.super__Vector_impl_data._M_start; ppOVar3 != ppOVar1;
      ppOVar3 = ppOVar3 + 1) {
    pOVar2 = *ppOVar3;
    if (pOVar2 != (Object *)0x0 && ((ulong)pOVar2 & 1) == 0) {
      (*pOVar2->_vptr_Object[1])();
    }
  }
  std::_Vector_base<wabt::interp::Object_*,_std::allocator<wabt::interp::Object_*>_>::~_Vector_base
            ((_Vector_base<wabt::interp::Object_*,_std::allocator<wabt::interp::Object_*>_> *)this);
  return;
}

Assistant:

FreeList<T>::~FreeList() {
  for (auto object : list_) {
    if ((reinterpret_cast<uintptr_t>(object) & ptrFreeBit) == 0) {
      delete object;
    }
  }
}